

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnhancedMode1Code.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EnhancedMode1Code::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnhancedMode1Code *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EnhancedMode1Code *local_18;
  EnhancedMode1Code *this_local;
  
  local_18 = this;
  this_local = (EnhancedMode1Code *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Enhanced Mode 1 Code: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code >> 9 & 7);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code >> 6 & 7);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code >> 3 & 7);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code & 7)
  ;
  poVar1 = std::operator<<(poVar1,"\n");
  ModeXCodeRecord::GetAsString_abi_cxx11_(&local_1f0,&this->super_ModeXCodeRecord);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EnhancedMode1Code::GetAsString() const
{
    KStringStream ss;

    ss << "Enhanced Mode 1 Code: " << m_CodeUnion.m_ui16Bits9_11
		                           << m_CodeUnion.m_ui16Bits6_8 
								   << m_CodeUnion.m_ui16Bits3_5 
								   << m_CodeUnion.m_ui16Bits0_2 
								   << "\n"
	   << IndentString( ModeXCodeRecord::GetAsString(), 1 );
 
    return ss.str();
}